

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

bool lest::match(texts *whats,text *line)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  pointer pbVar4;
  text local_70;
  text local_50;
  
  pbVar2 = (whats->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  do {
    pbVar4 = pbVar2;
    pbVar1 = (whats->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar4 == pbVar1) break;
    std::__cxx11::string::string((string *)&local_50,(string *)pbVar4);
    std::__cxx11::string::string((string *)&local_70,(string *)line);
    bVar3 = search(&local_50,&local_70);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    pbVar2 = pbVar4 + 1;
  } while (!bVar3);
  return pbVar4 != pbVar1;
}

Assistant:

inline bool match( texts whats, text line )
{
    for ( texts::iterator what = whats.begin(); what != whats.end() ; ++what )
    {
        if ( search( *what, line ) )
            return true;
    }
    return false;
}